

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

bool __thiscall
helics::TimeDependencies::checkIfAllDependenciesArePastExec(TimeDependencies *this,bool iterating)

{
  TimeState TVar1;
  pointer pDVar2;
  pointer pDVar3;
  pointer pDVar4;
  pointer pDVar5;
  TimeState TVar6;
  long lVar7;
  long lVar8;
  pointer pDVar9;
  
  TVar6 = !iterating * '\x02' + time_requested_require_iteration;
  pDVar4 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pDVar2 - (long)pDVar4;
  lVar7 = (lVar8 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  if (0 < lVar7) {
    pDVar3 = pDVar4 + lVar7 * 4;
    lVar7 = lVar7 + 1;
    pDVar9 = pDVar4 + 2;
    do {
      if (((pDVar9[-2].dependency == true) && (pDVar9[-2].connection != SELF)) &&
         (TVar1 = pDVar9[-2].super_TimeData.mTimeState, TVar1 < TVar6)) {
        pDVar5 = pDVar4;
        if (TVar1 != time_granted) goto LAB_00365290;
        if (pDVar9[-2].super_TimeData.next.internalTimeCode < 1) {
          pDVar5 = pDVar9 + -2;
          goto LAB_00365290;
        }
      }
      if (((pDVar9[-1].dependency == true) && (pDVar9[-1].connection != SELF)) &&
         (TVar1 = pDVar9[-1].super_TimeData.mTimeState, TVar1 < TVar6)) {
        if (TVar1 != time_granted) {
          pDVar5 = pDVar9 + -1;
          goto LAB_00365290;
        }
        if (pDVar9[-1].super_TimeData.next.internalTimeCode < 1) {
          pDVar5 = pDVar4 + 1;
          goto LAB_00365290;
        }
      }
      if (((pDVar9->dependency == true) && (pDVar9->connection != SELF)) &&
         (TVar1 = (pDVar9->super_TimeData).mTimeState, TVar1 < TVar6)) {
        if (TVar1 != time_granted) {
          pDVar5 = pDVar4 + 2;
          goto LAB_00365290;
        }
        pDVar5 = pDVar9;
        if ((pDVar9->super_TimeData).next.internalTimeCode < 1) goto LAB_00365290;
      }
      if (((pDVar9[1].dependency == true) && (pDVar9[1].connection != SELF)) &&
         (TVar1 = pDVar9[1].super_TimeData.mTimeState, TVar1 < TVar6)) {
        if (TVar1 != time_granted) {
          pDVar5 = pDVar9 + 1;
          goto LAB_00365290;
        }
        if (pDVar9[1].super_TimeData.next.internalTimeCode < 1) {
          pDVar5 = pDVar4 + 3;
          goto LAB_00365290;
        }
      }
      pDVar4 = pDVar4 + 4;
      lVar7 = lVar7 + -1;
      pDVar9 = pDVar9 + 4;
    } while (1 < lVar7);
    lVar8 = (long)pDVar2 - (long)pDVar3;
    pDVar4 = pDVar3;
  }
  lVar7 = (lVar8 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pDVar5 = pDVar2;
      if ((lVar7 != 3) ||
         (((pDVar4->dependency == true && (pDVar4->connection != SELF)) &&
          ((TVar1 = (pDVar4->super_TimeData).mTimeState, TVar1 < TVar6 &&
           ((pDVar5 = pDVar4, TVar1 != time_granted ||
            ((pDVar4->super_TimeData).next.internalTimeCode < 1)))))))) goto LAB_00365290;
      pDVar4 = pDVar4 + 1;
    }
    if ((((pDVar4->dependency == true) && (pDVar4->connection != SELF)) &&
        (TVar1 = (pDVar4->super_TimeData).mTimeState, TVar1 < TVar6)) &&
       ((pDVar5 = pDVar4, TVar1 != time_granted ||
        ((pDVar4->super_TimeData).next.internalTimeCode < 1)))) goto LAB_00365290;
    pDVar4 = pDVar4 + 1;
  }
  pDVar5 = pDVar2;
  if (((pDVar4->dependency == true) && (pDVar4->connection != SELF)) &&
     ((TVar1 = (pDVar4->super_TimeData).mTimeState, TVar1 < TVar6 &&
      ((pDVar5 = pDVar4, TVar1 == time_granted &&
       (0 < (pDVar4->super_TimeData).next.internalTimeCode)))))) {
    pDVar5 = pDVar2;
  }
LAB_00365290:
  return pDVar5 == pDVar2;
}

Assistant:

bool TimeDependencies::checkIfAllDependenciesArePastExec(bool iterating) const
{
    auto minstate =
        iterating ? TimeState::time_requested_require_iteration : TimeState::time_requested;

    return std::all_of(dependencies.begin(), dependencies.end(), [minstate](const auto& dep) {
        return ((!dep.dependency) || (dep.connection == ConnectionType::SELF) ||
                (dep.mTimeState >= minstate) ||
                (dep.mTimeState == TimeState::time_granted && dep.next > timeZero));
    });

    /* return std::none_of(dependencies.begin(), dependencies.end(), [minstate](const auto& dep) {
         return (dep.dependency && dep.connection != ConnectionType::SELF &&
                 (dep.mTimeState < minstate));
     });*/
}